

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::_OnChangedClipRect(ImDrawList *this)

{
  ImVec4 IVar1;
  int iVar2;
  ImDrawCmd *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImDrawCmd *pIVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  pIVar3 = (this->CmdBuffer).Data;
  iVar2 = (this->CmdBuffer).Size;
  pIVar7 = pIVar3 + (long)iVar2 + -1;
  if (pIVar3[(long)iVar2 + -1].ElemCount != 0) {
    IVar1 = pIVar7->ClipRect;
    auVar9[0] = -(*(char *)&(this->_CmdHeader).ClipRect.x == IVar1.x._0_1_);
    auVar9[1] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.x + 1) == IVar1.x._1_1_);
    auVar9[2] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.x + 2) == IVar1.x._2_1_);
    auVar9[3] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.x + 3) == IVar1.x._3_1_);
    auVar9[4] = -(*(char *)&(this->_CmdHeader).ClipRect.y == IVar1.y._0_1_);
    auVar9[5] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.y + 1) == IVar1.y._1_1_);
    auVar9[6] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.y + 2) == IVar1.y._2_1_);
    auVar9[7] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.y + 3) == IVar1.y._3_1_);
    auVar9[8] = -(*(char *)&(this->_CmdHeader).ClipRect.z == IVar1.z._0_1_);
    auVar9[9] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.z + 1) == IVar1.z._1_1_);
    auVar9[10] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.z + 2) == IVar1.z._2_1_);
    auVar9[0xb] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.z + 3) == IVar1.z._3_1_);
    auVar9[0xc] = -(*(char *)&(this->_CmdHeader).ClipRect.w == IVar1.w._0_1_);
    auVar9[0xd] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.w + 1) == IVar1.w._1_1_);
    auVar9[0xe] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.w + 2) == IVar1.w._2_1_);
    auVar9[0xf] = -(*(char *)((long)&(this->_CmdHeader).ClipRect.w + 3) == IVar1.w._3_1_);
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf)
        != 0xffff) {
      AddDrawCmd(this);
      return;
    }
  }
  if (pIVar3[(long)iVar2 + -1].UserCallback == (ImDrawCallback)0x0) {
    if ((((1 < iVar2) && (pIVar3[(long)iVar2 + -1].ElemCount == 0)) &&
        (auVar10[0] = -(*(char *)&pIVar3[(long)iVar2 + -2].ClipRect.x ==
                       *(char *)&(this->_CmdHeader).ClipRect.x),
        auVar10[1] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].ClipRect.x + 1) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.x + 1)),
        auVar10[2] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].ClipRect.x + 2) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.x + 2)),
        auVar10[3] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].ClipRect.x + 3) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.x + 3)),
        auVar10[4] = -(*(char *)&pIVar3[(long)iVar2 + -2].ClipRect.y ==
                      *(char *)&(this->_CmdHeader).ClipRect.y),
        auVar10[5] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].ClipRect.y + 1) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.y + 1)),
        auVar10[6] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].ClipRect.y + 2) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.y + 2)),
        auVar10[7] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].ClipRect.y + 3) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.y + 3)),
        auVar10[8] = -(*(char *)&pIVar3[(long)iVar2 + -2].ClipRect.z ==
                      *(char *)&(this->_CmdHeader).ClipRect.z),
        auVar10[9] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].ClipRect.z + 1) ==
                      *(char *)((long)&(this->_CmdHeader).ClipRect.z + 1)),
        auVar10[10] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].ClipRect.z + 2) ==
                       *(char *)((long)&(this->_CmdHeader).ClipRect.z + 2)),
        auVar10[0xb] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].ClipRect.z + 3) ==
                        *(char *)((long)&(this->_CmdHeader).ClipRect.z + 3)),
        auVar10[0xc] = -(*(char *)&pIVar3[(long)iVar2 + -2].ClipRect.w ==
                        *(char *)&(this->_CmdHeader).ClipRect.w),
        auVar10[0xd] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].ClipRect.w + 1) ==
                        *(char *)((long)&(this->_CmdHeader).ClipRect.w + 1)),
        auVar10[0xe] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].ClipRect.w + 2) ==
                        *(char *)((long)&(this->_CmdHeader).ClipRect.w + 2)),
        auVar10[0xf] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].ClipRect.w + 3) ==
                        *(char *)((long)&(this->_CmdHeader).ClipRect.w + 3)),
        auVar8[0] = -(*(char *)&pIVar3[(long)iVar2 + -2].ClipRect.w ==
                     *(char *)&(this->_CmdHeader).ClipRect.w),
        auVar8[1] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].ClipRect.w + 1) ==
                     *(char *)((long)&(this->_CmdHeader).ClipRect.w + 1)),
        auVar8[2] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].ClipRect.w + 2) ==
                     *(char *)((long)&(this->_CmdHeader).ClipRect.w + 2)),
        auVar8[3] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].ClipRect.w + 3) ==
                     *(char *)((long)&(this->_CmdHeader).ClipRect.w + 3)),
        auVar8[4] = -(*(char *)&pIVar3[(long)iVar2 + -2].TextureId ==
                     *(char *)&(this->_CmdHeader).TextureId),
        auVar8[5] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].TextureId + 1) ==
                     *(char *)((long)&(this->_CmdHeader).TextureId + 1)),
        auVar8[6] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].TextureId + 2) ==
                     *(char *)((long)&(this->_CmdHeader).TextureId + 2)),
        auVar8[7] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].TextureId + 3) ==
                     *(char *)((long)&(this->_CmdHeader).TextureId + 3)),
        auVar8[8] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].TextureId + 4) ==
                     *(char *)((long)&(this->_CmdHeader).TextureId + 4)),
        auVar8[9] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].TextureId + 5) ==
                     *(char *)((long)&(this->_CmdHeader).TextureId + 5)),
        auVar8[10] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].TextureId + 6) ==
                      *(char *)((long)&(this->_CmdHeader).TextureId + 6)),
        auVar8[0xb] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].TextureId + 7) ==
                       *(char *)((long)&(this->_CmdHeader).TextureId + 7)),
        auVar8[0xc] = -((char)pIVar3[(long)iVar2 + -2].VtxOffset ==
                       (char)(this->_CmdHeader).VtxOffset),
        auVar8[0xd] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].VtxOffset + 1) ==
                       *(char *)((long)&(this->_CmdHeader).VtxOffset + 1)),
        auVar8[0xe] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].VtxOffset + 2) ==
                       *(char *)((long)&(this->_CmdHeader).VtxOffset + 2)),
        auVar8[0xf] = -(*(char *)((long)&pIVar3[(long)iVar2 + -2].VtxOffset + 3) ==
                       *(char *)((long)&(this->_CmdHeader).VtxOffset + 3)),
        auVar8 = auVar8 & auVar10,
        (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff)) &&
       (pIVar3[(long)iVar2 + -2].UserCallback == (ImDrawCallback)0x0)) {
      (this->CmdBuffer).Size = iVar2 + -1;
      return;
    }
    fVar4 = (this->_CmdHeader).ClipRect.y;
    fVar5 = (this->_CmdHeader).ClipRect.z;
    fVar6 = (this->_CmdHeader).ClipRect.w;
    (pIVar7->ClipRect).x = (this->_CmdHeader).ClipRect.x;
    (pIVar7->ClipRect).y = fVar4;
    pIVar3[(long)iVar2 + -1].ClipRect.z = fVar5;
    pIVar3[(long)iVar2 + -1].ClipRect.w = fVar6;
    return;
  }
  __assert_fail("curr_cmd->UserCallback == __null",
                "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_draw.cpp"
                ,0x1f5,"void ImDrawList::_OnChangedClipRect()");
}

Assistant:

void ImDrawList::_OnChangedClipRect()
{
    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount != 0 && memcmp(&curr_cmd->ClipRect, &_CmdHeader.ClipRect, sizeof(ImVec4)) != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (curr_cmd->ElemCount == 0 && CmdBuffer.Size > 1 && ImDrawCmd_HeaderCompare(&_CmdHeader, prev_cmd) == 0 && prev_cmd->UserCallback == NULL)
    {
        CmdBuffer.pop_back();
        return;
    }

    curr_cmd->ClipRect = _CmdHeader.ClipRect;
}